

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varenaalloc.h
# Opt level: O0

NullLayer * __thiscall
VArenaAlloc::make<rlottie::internal::renderer::NullLayer,rlottie::internal::model::Layer*&>
          (VArenaAlloc *this,Layer **args)

{
  uint32_t uVar1;
  uint32_t padding_00;
  NullLayer *this_00;
  Layer *in_RDI;
  FooterAction *releaser;
  uint32_t padding;
  char *objStart;
  uint32_t alignment;
  uint32_t size;
  _lambda_char___1_ local_31;
  FooterAction *local_30;
  uint32_t in_stack_ffffffffffffffd8;
  uint32_t in_stack_ffffffffffffffdc;
  VArenaAlloc *in_stack_ffffffffffffffe0;
  
  uVar1 = ToU32(0x60);
  ToU32(8);
  this_00 = (NullLayer *)
            allocObjectWithFooter
                      (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8
                      );
  padding_00 = ToU32((long)this_00 -
                     (long)*(char **)((long)&(in_RDI->super_Group).super_Object.field_0 + 8));
  *(char **)((long)&(in_RDI->super_Group).super_Object.field_0 + 8) =
       (char *)((long)&(this_00->super_Layer)._vptr_Layer + (ulong)uVar1);
  local_30 = make(rlottie::internal::model::Layer*&)::{lambda(char*)#1}::
             operator_cast_to_function_pointer(&local_31);
  installFooter((VArenaAlloc *)in_RDI,local_30,padding_00);
  rlottie::internal::renderer::NullLayer::NullLayer(this_00,in_RDI);
  return this_00;
}

Assistant:

T* make(Args&&... args) {
        uint32_t size      = ToU32(sizeof(T));
        uint32_t alignment = ToU32(alignof(T));
        char* objStart;
        if (std::is_trivially_destructible<T>::value) {
            objStart = this->allocObject(size, alignment);
            fCursor = objStart + size;
        } else {
            objStart = this->allocObjectWithFooter(size + sizeof(Footer), alignment);
            // Can never be UB because max value is alignof(T).
            uint32_t padding = ToU32(objStart - fCursor);

            // Advance to end of object to install footer.
            fCursor = objStart + size;
            FooterAction* releaser = [](char* objEnd) {
                char* objStart = objEnd - (sizeof(T) + sizeof(Footer));
                ((T*)objStart)->~T();
                return objStart;
            };
            this->installFooter(releaser, padding);
        }

        // This must be last to make objects with nested use of this allocator work.
        return new(objStart) T(std::forward<Args>(args)...);
    }